

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

isminetype __thiscall wallet::CWallet::IsMine(CWallet *this,COutPoint *outpoint)

{
  long lVar1;
  element_type *peVar2;
  pointer pCVar3;
  isminetype iVar4;
  CWalletTx *pCVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = GetWalletTx(this,(uint256 *)outpoint);
  if (pCVar5 != (CWalletTx *)0x0) {
    peVar2 = (pCVar5->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)outpoint->n <
        (ulong)(((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar3) / 0x28)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        iVar4 = IsMine(this,(CScript *)((long)(pCVar3 + outpoint->n) + 8));
        return iVar4;
      }
      goto LAB_0014b7c2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ISMINE_NO;
  }
LAB_0014b7c2:
  __stack_chk_fail();
}

Assistant:

isminetype CWallet::IsMine(const COutPoint& outpoint) const
{
    AssertLockHeld(cs_wallet);
    auto wtx = GetWalletTx(outpoint.hash);
    if (!wtx) {
        return ISMINE_NO;
    }
    if (outpoint.n >= wtx->tx->vout.size()) {
        return ISMINE_NO;
    }
    return IsMine(wtx->tx->vout[outpoint.n]);
}